

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O0

bool bsim::operator>(signed_int<12> *a,signed_int<12> *b)

{
  uchar uVar1;
  byte bVar2;
  int i;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  uVar1 = signed_int<12>::get((signed_int<12> *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
  if ((uVar1 == '\x01') &&
     (uVar1 = signed_int<12>::get((signed_int<12> *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffdc), uVar1 == '\0')) {
    return false;
  }
  uVar1 = signed_int<12>::get((signed_int<12> *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
  if ((uVar1 == '\x01') &&
     (uVar1 = signed_int<12>::get((signed_int<12> *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                  in_stack_ffffffffffffffdc), uVar1 == '\0')) {
    return true;
  }
  iVar3 = 10;
  while( true ) {
    if (iVar3 < 0) {
      return false;
    }
    bVar2 = signed_int<12>::get((signed_int<12> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    in_stack_ffffffffffffffe0 = (uint)bVar2;
    bVar2 = signed_int<12>::get((signed_int<12> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    if ((int)(uint)bVar2 < (int)in_stack_ffffffffffffffe0) break;
    bVar2 = signed_int<12>::get((signed_int<12> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    in_stack_ffffffffffffffdc = (uint)bVar2;
    bVar2 = signed_int<12>::get((signed_int<12> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    if ((int)in_stack_ffffffffffffffdc < (int)(uint)bVar2) {
      return false;
    }
    iVar3 = iVar3 + -1;
  }
  return true;
}

Assistant:

static inline bool operator>(const signed_int<N>& a,
			       const signed_int<N>& b) {

    // a negative b non-negative
    if ((a.get(N - 1) == 1) && (b.get(N - 1) == 0)) {
      return false;
    }

    // b negative a non-negative
    if ((b.get(N - 1) == 1) && (a.get(N - 1) == 0)) {
      return true;
    }

    // Both negative or both non-negative
    //if ((a.get(N - 1) == 1) && (b.get(N - 1) == 1)) {

    for (int i = N - 2; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
	return true;
      }

      if (a.get(i) < b.get(i)) {
	return false;
      }
    }

    return false;

  }